

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execmd.c
# Opt level: O3

void vocdusave_delobj(voccxdef *ctx,objnum objn)

{
  ushort *puVar1;
  ushort uVar2;
  objucxdef *undoctx;
  uint16_t tmp_1;
  uchar *puVar3;
  uint16_t tmp;
  int wrdsiz;
  int wrdcnt;
  delobj_cb_ctx fnctx;
  int local_4c;
  uchar *local_48;
  int local_3c;
  uchar *local_38;
  
  undoctx = ctx->voccxundo;
  local_48 = mcmlck(ctx->voccxmem,objn);
  uVar2 = *(ushort *)(local_48 + 8);
  voc_count(ctx,objn,0,&local_3c,&local_4c);
  local_4c = local_3c * 6 + local_4c;
  puVar3 = objures(undoctx,'\x05',(short)local_4c + uVar2 + 7);
  *puVar3 = '\x03';
  *(objnum *)(puVar3 + 1) = objn;
  *(ushort *)(puVar3 + 3) = uVar2;
  *(undefined2 *)(puVar3 + 5) = (undefined2)local_4c;
  memcpy(puVar3 + 7,local_48,(ulong)uVar2);
  local_38 = puVar3 + (ulong)uVar2 + 7;
  voc_iterate(ctx,objn,delobj_cb,&local_38);
  mcmunlck(ctx->voccxmem,objn);
  puVar1 = &undoctx->objucxhead;
  *puVar1 = *puVar1 + uVar2 + 7 + (short)local_4c;
  return;
}

Assistant:

void vocdusave_delobj(voccxdef *ctx, objnum objn)
{
    objucxdef *uc = ctx->voccxundo;
    uchar     *p;
    uchar     *objp;
    uint       siz;
    int        wrdsiz;
    int        wrdcnt;
    struct delobj_cb_ctx fnctx;

    /* figure out how much we need to save */
    objp = mcmlck(ctx->voccxmem, (mcmon)objn);
    siz = objfree(objp);

    /* figure the word size */
    voc_count(ctx, objn, 0, &wrdcnt, &wrdsiz);

    /*
     *   we need to store an additional 6 bytes (2-length1, 2-length2,
     *   1-type, 1-flags) for each word 
     */
    wrdsiz += wrdcnt*6;

    /* set up the undo header */
    p = objures(uc, OBJUCLI, (ushort)(7 + siz + wrdsiz));
    *p = VOC_UNDO_DELOBJ;
    oswp2(p+1, objn);
    oswp2(p+3, siz);
    oswp2(p+5, wrdsiz);

    /* save the object's data */
    memcpy(p+7, objp, (size_t)siz);

    /* write the words */
    fnctx.p = p+7 + siz;
    voc_iterate(ctx, objn, delobj_cb, &fnctx);

    /* unlock the object and advance the undo pointer */
    mcmunlck(ctx->voccxmem, (mcmon)objn);
    uc->objucxhead += 7 + siz + wrdsiz;
}